

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfContext.cpp
# Opt level: O0

void __thiscall Imf_3_4::Context::Context(void *param_1,char *param_2,undefined8 param_3)

{
  int iVar1;
  element_type *pp_Var2;
  ostream *poVar3;
  InputExc *this;
  stringstream _iex_throw_s;
  Context *in_stack_fffffffffffffe20;
  stringstream local_1b8 [16];
  ostream local_1a8 [392];
  undefined8 local_20;
  char *local_18;
  void *local_10;
  
  local_20 = param_3;
  local_18 = param_2;
  local_10 = param_1;
  Context(in_stack_fffffffffffffe20);
  pp_Var2 = std::__shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>::get
                      ((__shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2> *)param_1);
  iVar1 = exr_start_write(pp_Var2,local_18,0,local_20);
  if (iVar1 != 0) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1b8);
    poVar3 = std::operator<<(local_1a8,"Unable to open \'");
    poVar3 = std::operator<<(poVar3,local_18);
    std::operator<<(poVar3,"\' for write");
    this = (InputExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::InputExc::InputExc(this,local_1b8);
    __cxa_throw(this,&Iex_3_4::InputExc::typeinfo,Iex_3_4::InputExc::~InputExc);
  }
  return;
}

Assistant:

Context::Context (const char* filename, const ContextInitializer& ctxtinit, write_mode_t)
    : Context()
{
    if (EXR_ERR_SUCCESS != exr_start_write (
                               _ctxt.get (),
                               filename,
                               EXR_WRITE_FILE_DIRECTLY,
                               &(ctxtinit._initializer)))
    {
        THROW (
            IEX_NAMESPACE::InputExc,
            "Unable to open '" << filename << "' for write");
    }
}